

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_shader_program_from_files.h
# Opt level: O0

bool create_shader_program_from_files
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *vertex_shader_paths,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *tess_control_shader_paths,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *tess_evaluation_shader_paths,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *fragment_shader_paths,GLuint *id)

{
  GLuint GVar1;
  ostream *poVar2;
  int local_64;
  anon_class_8_1_3fcf65d9 aStack_60;
  GLint status;
  anon_class_8_1_3fcf65d9 *local_58;
  anon_class_8_1_3fcf65d9 *detach;
  GLuint local_48;
  GLuint f;
  GLuint te;
  GLuint tc;
  GLuint v;
  anon_class_1_0_00000001 create_compile_attach;
  GLuint *id_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *fragment_shader_paths_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tess_evaluation_shader_paths_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tess_control_shader_paths_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vertex_shader_paths_local;
  
  _v = id;
  GVar1 = (*glad_glCreateProgram)();
  *_v = GVar1;
  if (*_v == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[1m\x1b[31m");
    poVar2 = std::operator<<(poVar2,"ERROR");
    poVar2 = std::operator<<(poVar2,"\x1b[m");
    poVar2 = std::operator<<(poVar2,": could not create shader program.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    vertex_shader_paths_local._7_1_ = false;
  }
  else {
    te = 0;
    f = 0;
    local_48 = 0;
    detach._4_4_ = 0;
    create_shader_program_from_files::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&tc + 3),vertex_shader_paths,0x8b31,*_v,&te);
    create_shader_program_from_files::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&tc + 3),tess_control_shader_paths,0x8e88,*_v,&f);
    create_shader_program_from_files::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&tc + 3),tess_evaluation_shader_paths,0x8e87,*_v,
               &local_48);
    create_shader_program_from_files::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&tc + 3),fragment_shader_paths,0x8b30,*_v,
               (GLuint *)((long)&detach + 4));
    (*glad_glLinkProgram)(*_v);
    aStack_60.id = _v;
    local_58 = &stack0xffffffffffffffa0;
    create_shader_program_from_files::anon_class_8_1_3fcf65d9::operator()(local_58,detach._4_4_);
    create_shader_program_from_files::anon_class_8_1_3fcf65d9::operator()(local_58,te);
    print_program_info_log(*_v);
    (*glad_glGetProgramiv)(*_v,0x8b82,&local_64);
    if (local_64 == 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[1m\x1b[32m");
      poVar2 = std::operator<<(poVar2,"shader compilation successful.");
      poVar2 = std::operator<<(poVar2,"\x1b[m");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      vertex_shader_paths_local._7_1_ = true;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[1m\x1b[31m");
      poVar2 = std::operator<<(poVar2,"ERROR");
      poVar2 = std::operator<<(poVar2,"\x1b[m");
      poVar2 = std::operator<<(poVar2,": Failed to link shader program");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      vertex_shader_paths_local._7_1_ = false;
    }
  }
  return vertex_shader_paths_local._7_1_;
}

Assistant:

inline bool create_shader_program_from_files(
  const std::vector<std::string> & vertex_shader_paths,
  const std::vector<std::string> & tess_control_shader_paths,
  const std::vector<std::string> & tess_evaluation_shader_paths,
  const std::vector<std::string> & fragment_shader_paths,
  GLuint & id)
{
  const auto create_compile_attach = [](
    const std::vector<std::string> & paths, 
    const GLenum type, 
    const GLuint prog_id, 
    GLuint & s) -> bool
  {
    const std::string type_str = 
      (type == GL_VERTEX_SHADER ?                STR(BOLD("vertex shader")) :
        (type == GL_FRAGMENT_SHADER ?            STR(BOLD("fragment shader")) :
          (type == GL_TESS_CONTROL_SHADER ?      STR(BOLD("tessellation control shader")) :
            (type == GL_TESS_EVALUATION_SHADER ? STR(BOLD("tessellation evaluation shader")) : 
               "unknown shader"))));
    int total_length = 0;
    std::vector<std::string> strs;
    {
      for(int p = 0;p<paths.size();p++)
      {
        const auto & path = paths[p];
        std::ifstream t(path);
        if(t.fail())
        {
          std::cerr<<REDRUM("ERROR")<<": failed to open "<<path<<std::endl;
          return false;
        }
        std::stringstream buffer;
        buffer << t.rdbuf();
        if(p!=0)
        {
          strs.push_back(STR(std::endl<<"#line 1 "<<p<<std::endl));
        }
        strs.push_back(buffer.str());
        total_length += buffer.str().length();
      }
    }
    std::vector<const char *> cstrs;
    for(const auto & str : strs)
    {
      cstrs.emplace_back(str.c_str());
    }
    if(total_length == 0)
    {
      std::cerr<<YELLOWRUM("WARNING")<<": "<<type_str<<" is empty..."<<std::endl;;
      s = 0;
      return false;
    }
    s = glCreateShader(type);
    if(s == 0)
    {
      std::cerr<<"failed to create "<<type_str<<std::endl;
      return false;
    }
    {
      glShaderSource(s,cstrs.size(),&cstrs[0],NULL);
    }
    glCompileShader(s);
    print_shader_info_log(type_str,s,paths);
    if(!glIsShader(s))
    {
      std::cerr<<type_str<<" failed to compile."<<std::endl;
      return false;
    }
    glAttachShader(prog_id,s);
    return true;
  };

  // create program
  id = glCreateProgram();
  if(id == 0)
  {
    std::cerr<<REDRUM("ERROR")<<": could not create shader program."<<std::endl;
    return false;
  }

  // create shaders
  GLuint v=0,tc=0,te=0,f=0;

  create_compile_attach(vertex_shader_paths,GL_VERTEX_SHADER,id,v);
  create_compile_attach(tess_control_shader_paths,GL_TESS_CONTROL_SHADER,id,tc);
  create_compile_attach(tess_evaluation_shader_paths,GL_TESS_EVALUATION_SHADER,id,te);
  create_compile_attach(fragment_shader_paths,GL_FRAGMENT_SHADER,id,f);

  // Link program
  glLinkProgram(id);
  const auto & detach = [&id](const GLuint shader)
  {
    if(shader)
    {
      glDetachShader(id,shader);
      glDeleteShader(shader);
    }
  };
  detach(f);
  detach(v);

  // print log if any
  print_program_info_log(id);
  GLint status;
  glGetProgramiv(id,GL_LINK_STATUS,&status);
  if(status != GL_TRUE)
  {
    std::cerr<<REDRUM("ERROR")<<": Failed to link shader program"<<std::endl;
    return false;
  }

  std::cout<<GREENRUM("shader compilation successful.")<<std::endl;
  return true;
}